

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

Lazy<cinatra::chunked_result> __thiscall
cinatra::coro_http_connection::read_chunked(coro_http_connection *this)

{
  long lVar1;
  string_view delim;
  bool bVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 *extraout_RAX;
  size_type sVar6;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *puVar7;
  error_code *this_00;
  long *plVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  size_type *psVar11;
  undefined8 in_RSI;
  LazyBase<cinatra::chunked_result,_false> in_RDI;
  basic_streambuf<std::allocator<char>_> *this_02;
  __integer_from_chars_result_type<unsigned_long> _Var12;
  error_code eVar13;
  char *data_ptr;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  basic_streambuf<std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  coro_http_connection *in_stack_fffffffffffffc08;
  size_type n;
  basic_streambuf<std::allocator<char>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  int local_3c8;
  int local_3a8;
  int local_360;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  const_buffer local_1e8;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_1d8;
  int local_190;
  undefined4 uStack_18c;
  error_category *local_188;
  const_buffer local_150;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_128;
  __sv_type local_110;
  const_buffer local_88;
  char *local_78;
  
  puVar3 = (undefined8 *)operator_new(0x158,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar3 = read_chunked;
  puVar3[1] = read_chunked;
  puVar7 = puVar3 + 0xb;
  this_00 = (error_code *)(puVar3 + 0x16);
  plVar8 = puVar3 + 0x1f;
  puVar9 = puVar3 + 0x23;
  puVar10 = puVar3 + 0x24;
  this_01 = (basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x18);
  psVar11 = puVar3 + 0x25;
  puVar3[0x29] = in_RSI;
  async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::LazyPromise
            ((LazyPromise<cinatra::chunked_result> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::get_return_object
            ((LazyPromise<cinatra::chunked_result> *)
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
  bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x155));
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0x154) = 0;
    read_chunked(in_stack_fffffffffffffbf0,
                 (void *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x155));
  sVar4 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffbf0);
  if (sVar4 != 0) {
    lVar1 = puVar3[0x29];
    local_88 = (const_buffer)
               asio::basic_streambuf<std::allocator<char>_>::data(in_stack_fffffffffffffc10);
    pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x424766);
    local_78 = pcVar5;
    asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffbf0);
    std::streambuf::sputn((char *)(lVar1 + 0xf8),(long)pcVar5);
    asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffbf0);
    asio::basic_streambuf<std::allocator<char>_>::consume
              (in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
  }
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  *(undefined1 *)(puVar3 + 0xd) = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0xe));
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  *plVar8 = 0;
  local_110 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  delim._M_str._0_4_ = in_stack_fffffffffffffc18;
  delim._M_len = (size_t)in_stack_fffffffffffffc10;
  delim._M_str._4_4_ = in_stack_fffffffffffffc1c;
  async_read_until<asio::basic_streambuf<std::allocator<char>>>
            (in_stack_fffffffffffffc08,
             (basic_streambuf<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),delim);
  async_simple::coro::detail::LazyPromiseBase::
  await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  bVar2 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
          await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x20)
                     );
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0x154) = 1;
    read_chunked((void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (void *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    (*(code *)*extraout_RAX)(extraout_RAX);
    return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
  }
  puVar3[0x1c] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x20);
  async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
  awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  std::tie<std::error_code,unsigned_long>
            ((error_code *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  local_128 = std::tuple<std::error_code&,unsigned_long&>::operator=
                        ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffbf0,
                         (pair<std::error_code,_unsigned_long> *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
  ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x424a54);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x424a61);
  bVar2 = std::error_code::operator_cast_to_bool(this_00);
  if (bVar2) {
    *puVar7 = *(undefined8 *)this_00;
    puVar3[0xc] = puVar3[0x17];
    close((coro_http_connection *)puVar3[0x29],1);
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
    return_value<cinatra::chunked_result>
              ((LazyPromise<cinatra::chunked_result> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (chunked_result *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    local_360 = 3;
    goto LAB_004251c3;
  }
  sVar4 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffbf0);
  puVar3[0x22] = sVar4;
  *puVar9 = puVar3[0x22] - *plVar8;
  local_150 = (const_buffer)
              asio::basic_streambuf<std::allocator<char>_>::data(in_stack_fffffffffffffc10);
  pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x424bab);
  *puVar10 = pcVar5;
  pcVar5 = (char *)*puVar10;
  lVar1 = *plVar8;
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CRCF_abi_cxx11_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_01,pcVar5,lVar1 - sVar6);
  std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::size(this_01);
  _Var12 = std::from_chars<unsigned_long>
                     ((char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                      (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                      (unsigned_long *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  puVar3[0x1a] = _Var12.ptr;
  *(errc *)(puVar3 + 0x1b) = _Var12.ec;
  if (*(int *)(puVar3 + 0x1b) == 0) {
    asio::basic_streambuf<std::allocator<char>_>::consume
              (in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
    if (*puVar9 < *psVar11 + 2) {
      puVar3[0x26] = (*psVar11 - *puVar9) + 2;
      async_read<asio::basic_streambuf<std::allocator<char>>&>
                ((coro_http_connection *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 in_stack_fffffffffffffbf0,
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      bVar2 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar3 + 0x27));
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x154) = 2;
        read_chunked((void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (void *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        (*(code *)*extraout_RAX_00)(extraout_RAX_00);
        return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
      }
      puVar3[0x1d] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x27);
      async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
      awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                  CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::tie<std::error_code,unsigned_long>
                ((error_code *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      local_1d8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                            ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffbf0,
                             (pair<std::error_code,_unsigned_long> *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
      ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x424f71);
      async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x424f7e);
      bVar2 = std::error_code::operator_cast_to_bool(this_00);
      if (bVar2) {
        *puVar7 = *(undefined8 *)this_00;
        puVar3[0xc] = puVar3[0x17];
        close((coro_http_connection *)puVar3[0x29],1);
        async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
        return_value<cinatra::chunked_result>
                  ((LazyPromise<cinatra::chunked_result> *)
                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (chunked_result *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        local_3c8 = 3;
      }
      else {
        local_3c8 = 0;
      }
      if (local_3c8 != 0) {
        local_3a8 = local_3c8;
        goto LAB_004251a9;
      }
    }
    if (*psVar11 == 0) {
      asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffbf0);
      asio::basic_streambuf<std::allocator<char>_>::consume
                (in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
      *(undefined1 *)(puVar3 + 0xd) = 1;
      async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
      return_value<cinatra::chunked_result>
                ((LazyPromise<cinatra::chunked_result> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (chunked_result *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_3a8 = 3;
    }
    else {
      this_02 = (basic_streambuf<std::allocator<char>_> *)(puVar3[0x29] + 0xf8);
      local_1e8 = (const_buffer)asio::basic_streambuf<std::allocator<char>_>::data(this_02);
      pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x425113);
      *puVar10 = pcVar5;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1f8,(char *)*puVar10,*psVar11);
      puVar3[0xe] = local_1f8._M_len;
      puVar3[0xf] = local_1f8._M_str;
      n = *psVar11;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CRCF_abi_cxx11_);
      asio::basic_streambuf<std::allocator<char>_>::consume(this_02,n);
      async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
      return_value<cinatra::chunked_result>
                ((LazyPromise<cinatra::chunked_result> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (chunked_result *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_3a8 = 3;
    }
  }
  else {
    cerr_logger_t::operator<<
              ((cerr_logger_t *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (char (*) [17])CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x424cba);
    eVar13 = std::make_error_code(0);
    local_188 = eVar13._M_cat;
    local_190 = eVar13._M_value;
    *puVar7 = CONCAT44(uStack_18c,local_190);
    puVar3[0xc] = local_188;
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
    return_value<cinatra::chunked_result>
              ((LazyPromise<cinatra::chunked_result> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (chunked_result *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    local_3a8 = 3;
  }
LAB_004251a9:
  local_360 = local_3a8;
LAB_004251c3:
  if (local_360 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)((long)puVar3 + 0x156));
    if (!bVar2) {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0x154) = 3;
      read_chunked(in_stack_fffffffffffffbf0,
                   (void *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      (*(code *)*extraout_RAX_01)(extraout_RAX_01);
      return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
              ((FinalAwaiter *)((long)puVar3 + 0x156));
  }
  async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::~LazyPromise
            ((LazyPromise<cinatra::chunked_result> *)0x425337);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x158);
  }
  return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<chunked_result> read_chunked() {
    if (head_buf_.size() > 0) {
      const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      chunked_buf_.sputn(data_ptr, head_buf_.size());
      head_buf_.consume(head_buf_.size());
    }

    chunked_result result{};
    std::error_code ec{};
    size_t size = 0;

    if (std::tie(ec, size) = co_await async_read_until(chunked_buf_, CRCF);
        ec) {
      result.ec = ec;
      close();
      co_return result;
    }

    size_t buf_size = chunked_buf_.size();
    size_t additional_size = buf_size - size;
    const char *data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    std::string_view size_str(data_ptr, size - CRCF.size());
    size_t chunk_size;
    auto [ptr, err] = std::from_chars(
        size_str.data(), size_str.data() + size_str.size(), chunk_size, 16);
    if (err != std::errc{}) {
      CINATRA_LOG_ERROR << "bad chunked size";
      result.ec = std::make_error_code(std::errc::invalid_argument);
      co_return result;
    }

    chunked_buf_.consume(size);

    if (additional_size < size_t(chunk_size + 2)) {
      // not a complete chunk, read left chunk data.
      size_t size_to_read = chunk_size + 2 - additional_size;
      if (std::tie(ec, size) = co_await async_read(chunked_buf_, size_to_read);
          ec) {
        result.ec = ec;
        close();
        co_return result;
      }
    }

    if (chunk_size == 0) {
      // all finished, no more data
      chunked_buf_.consume(chunked_buf_.size());
      result.eof = true;
      co_return result;
    }

    data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    result.data = std::string_view{data_ptr, (size_t)chunk_size};
    chunked_buf_.consume(chunk_size + CRCF.size());

    co_return result;
  }